

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int choose_size_bytes(uint32_t size,int spare_msbs)

{
  uint uVar1;
  int spare_msbs_local;
  uint32_t size_local;
  undefined4 local_4;
  
  if ((spare_msbs < 1) || (size >> (0x20 - (byte)spare_msbs & 0x1f) == 0)) {
    uVar1 = size << ((byte)spare_msbs & 0x1f);
    if (uVar1 >> 0x18 == 0) {
      if (uVar1 >> 0x10 == 0) {
        if (uVar1 >> 8 == 0) {
          local_4 = 1;
        }
        else {
          local_4 = 2;
        }
      }
      else {
        local_4 = 3;
      }
    }
    else {
      local_4 = 4;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int choose_size_bytes(uint32_t size, int spare_msbs) {
  // Choose the number of bytes required to represent size, without
  // using the 'spare_msbs' number of most significant bits.

  // Make sure we will fit in 4 bytes to start with..
  if (spare_msbs > 0 && size >> (32 - spare_msbs) != 0) return -1;

  // Normalise to 32 bits
  size <<= spare_msbs;

  if (size >> 24 != 0)
    return 4;
  else if (size >> 16 != 0)
    return 3;
  else if (size >> 8 != 0)
    return 2;
  else
    return 1;
}